

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O1

void __thiscall deqp::gls::TextureTestUtil::ProgramLibrary::clear(ProgramLibrary *this)

{
  ShaderProgram *this_00;
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->m_programs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_programs)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (ShaderProgram *)p_Var1[1]._M_parent;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    p_Var1[1]._M_parent = (_Base_ptr)0x0;
  }
  std::
  _Rb_tree<deqp::gls::TextureTestUtil::Program,_std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>,_std::_Select1st<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>,_std::less<deqp::gls::TextureTestUtil::Program>,_std::allocator<std::pair<const_deqp::gls::TextureTestUtil::Program,_glu::ShaderProgram_*>_>_>
  ::clear(&(this->m_programs)._M_t);
  return;
}

Assistant:

void ProgramLibrary::clear (void)
{
	for (map<Program, glu::ShaderProgram*>::iterator i = m_programs.begin(); i != m_programs.end(); i++)
	{
		delete i->second;
		i->second = DE_NULL;
	}
	m_programs.clear();
}